

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::internal::DecodeRoute64
                  (Error *__return_storage_ptr__,Route64 *aRoute64,ByteArray *aBuf)

{
  byte bVar1;
  pointer puVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar7;
  format_args args;
  format_args args_00;
  RouteDataEntry entry;
  ByteArray routerIdList;
  string local_78;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar5 < 9) {
    entry.mRouterId = '\0';
    entry.mOutgoingLinkQuality = '\0';
    entry.mIncomingLinkQuality = '\0';
    entry.mRouteCost = '\0';
    pcVar4 = "incorrect size of Route64";
    while (pcVar3 = pcVar4, pcVar3 != "") {
      pcVar4 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&entry);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&entry;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"incorrect size of Route64",(string_view)ZEXT816(0x19),args);
    local_58._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_78);
  }
  else {
    aRoute64->mIdSequence = *puVar2;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&entry,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + 1),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + 9),(allocator_type *)local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&aRoute64->mMask,&entry);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&entry);
    ExtractRouterIds((ByteArray *)&entry,&aRoute64->mMask);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&routerIdList,&entry)
    ;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&entry);
    lVar6 = uVar5 - 9;
    if (lVar6 == (long)routerIdList.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)routerIdList.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) {
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
        bVar1 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7 + 9];
        entry._0_2_ = CONCAT11(bVar1 >> 6,
                               routerIdList.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar7]);
        entry = (RouteDataEntry)(CONCAT13(bVar1,CONCAT12(bVar1 >> 4,entry._0_2_)) & 0xf03ffff);
        std::
        vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>::
        emplace_back<ot::commissioner::RouteDataEntry&>
                  ((vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>
                    *)&aRoute64->mRouteData,&entry);
      }
      goto LAB_0019e27f;
    }
    entry.mRouterId = '\0';
    entry.mOutgoingLinkQuality = '\0';
    entry.mIncomingLinkQuality = '\0';
    entry.mRouteCost = '\0';
    pcVar4 = "incorrect size of RouteData";
    while (pcVar3 = pcVar4, pcVar3 != "") {
      pcVar4 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&entry);
      }
    }
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&entry;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"incorrect size of RouteData",(string_view)ZEXT816(0x1b),args_00);
    local_58._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_78);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
LAB_0019e27f:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeRoute64(Route64 &aRoute64, const ByteArray &aBuf)
{
    Error     error;
    size_t    length = aBuf.size();
    size_t    offset = 0;
    ByteArray routerIdList;

    VerifyOrExit(length >= kRouterIdMaskBytes + 1, error = ERROR_BAD_FORMAT("incorrect size of Route64"));
    aRoute64.mIdSequence = aBuf[offset++];
    aRoute64.mMask       = {aBuf.begin() + offset, aBuf.begin() + offset + kRouterIdMaskBytes};
    offset += kRouterIdMaskBytes;

    routerIdList = ExtractRouterIds(aRoute64.mMask);
    VerifyOrExit((length - offset) == routerIdList.size(), error = ERROR_BAD_FORMAT("incorrect size of RouteData"));
    while (offset < length)
    {
        RouteDataEntry entry;
        entry.mRouterId = routerIdList[offset - kRouterIdMaskBytes - 1];
        DecodeRouteDataEntry(entry, aBuf[offset]);
        aRoute64.mRouteData.emplace_back(entry);
        offset++;
    }

exit:
    return error;
}